

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fixed-dtoa.cc
# Opt level: O1

void TestFastFixedDtoaGayFixed(void)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  PrecomputedFixed *pPVar5;
  char *pcVar6;
  undefined8 uVar7;
  int *in_R9;
  long lVar8;
  Vector<const_double_conversion::PrecomputedFixed> VVar9;
  Vector<char> buffer;
  int point;
  int length;
  char buffer_container [500];
  undefined8 in_stack_fffffffffffffdc8;
  uint local_230;
  int local_22c;
  char local_228 [504];
  
  VVar9 = double_conversion::PrecomputedFixedRepresentations();
  pPVar5 = VVar9.start_;
  if (0 < VVar9.length_) {
    lVar8 = 0;
    do {
      uVar1 = *(uint *)((long)&pPVar5->number_digits + lVar8);
      pcVar6 = *(char **)((long)&pPVar5->representation + lVar8);
      uVar2 = *(uint *)((long)&pPVar5->decimal_point + lVar8);
      buffer._8_8_ = &local_22c;
      buffer.start_ = (char *)0x1f4;
      bVar3 = double_conversion::FastFixedDtoa
                        ((double_conversion *)(ulong)uVar1,*(double *)((long)&pPVar5->v + lVar8),
                         (int)local_228,buffer,(int *)&local_230,in_R9);
      if (!bVar3) {
        pcVar6 = "status";
        uVar7 = 0x1fe;
LAB_00869b05:
        printf("%s:%d:\n CHECK(%s) failed\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fixed-dtoa.cc"
               ,uVar7,pcVar6);
        abort();
      }
      if (uVar2 != local_230) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fixed-dtoa.cc"
               ,0x1ff,"current_test.decimal_point","point",(ulong)uVar2,
               CONCAT44((int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),local_230));
LAB_00869ae6:
        abort();
      }
      if ((int)uVar1 < (int)(local_22c - local_230)) {
        pcVar6 = "number_digits >= length - point";
        uVar7 = 0x200;
        goto LAB_00869b05;
      }
      if (pcVar6 == (char *)0x0) goto LAB_00869ae6;
      iVar4 = strcmp(pcVar6,local_228);
      if (iVar4 != 0) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fixed-dtoa.cc"
               ,0x201,"current_test.representation","buffer.start()",pcVar6,local_228);
        abort();
      }
      lVar8 = lVar8 + 0x20;
    } while ((ulong)(uint)VVar9.length_ << 5 != lVar8);
  }
  return;
}

Assistant:

TEST(FastFixedDtoaGayFixed) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool status;
  int length;
  int point;

  Vector<const PrecomputedFixed> precomputed =
      PrecomputedFixedRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedFixed current_test = precomputed[i];
    double v = current_test.v;
    int number_digits = current_test.number_digits;
    status = FastFixedDtoa(v, number_digits,
                           buffer, &length, &point);
    CHECK(status);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK(number_digits >= length - point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}